

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void freearg(arg_t *a)

{
  attr *in_RDI;
  arg_t *p;
  attr *paVar1;
  
  while (in_RDI != (attr *)0x0) {
    freeattr(in_RDI);
    paVar1 = (attr *)(in_RDI->field_1).basic;
    free(in_RDI);
    in_RDI = paVar1;
  }
  return;
}

Assistant:

static void freearg(struct arg_t *a) {
    struct arg_t *p = a;
    while (p) {
        freeattr(p->arg);
        a = p;
        p = p->next;
        free(a);
    }
}